

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

ostream * symbols::operator<<(ostream *out,Object *obj)

{
  string local_30 [32];
  
  (*obj->_vptr_Object[3])(local_30);
  std::operator<<(out,local_30);
  std::__cxx11::string::~string(local_30);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream &out, Object const *obj)
    {
        out << obj->toString();
        return out;
    }